

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superAnd.c
# Opt level: O1

void Super2_LibWriteGate(FILE *pFile,Super2_Lib_t *pLib,Super2_Gate_t *pGate)

{
  uint uVar1;
  uint uVar2;
  char *__s;
  uint uTruth;
  uint local_24;
  
  uVar1 = pGate->uTruth;
  uVar2 = pLib->uMaskBit;
  Extra_PrintBinary(pFile,&local_24,pLib->nMints);
  fwrite("   ",3,1,(FILE *)pFile);
  __s = Super2_LibWriteGate_rec(pGate,uVar2 & uVar1,pLib->nLevels);
  fputs(__s,(FILE *)pFile);
  fputc(10,(FILE *)pFile);
  return;
}

Assistant:

void Super2_LibWriteGate( FILE * pFile, Super2_Lib_t * pLib, Super2_Gate_t * pGate )
{
//    unsigned uTruthR;
    unsigned uTruth;
    int fInv;

    // check whether the gate need complementation
    fInv = (int)(pGate->uTruth & pLib->uMaskBit);
    uTruth = (fInv? ~pGate->uTruth : pGate->uTruth);
/*
    // reverse the truth table
    uTruthR = 0;
    for ( m = 0; m < pLib->nMints; m++ )
        if ( uTruth & (1 << m) )
            uTruthR |= (1 << (pLib->nMints-1-m));
*/
    // write the truth table
    Extra_PrintBinary( pFile, &uTruth, pLib->nMints );
    fprintf( pFile, "   " );
    // write the symbolic expression
    fprintf( pFile, "%s", Super2_LibWriteGate_rec( pGate, fInv, pLib->nLevels ) );
    fprintf( pFile, "\n" );
}